

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_bnd_jmp(DisasContext *s)

{
  TCGContext *tcg_ctx;
  TCGTemp *local_8;
  
  if (((s->prefix & 2) == 0) && ((~(uint)s->flags & 0x6000000) == 0)) {
    tcg_ctx = s->uc->tcg_ctx;
    local_8 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    tcg_gen_callN_x86_64(tcg_ctx,helper_bnd_jmp_x86_64,(TCGTemp *)0x0,1,&local_8);
  }
  return;
}

Assistant:

static void gen_bnd_jmp(DisasContext *s)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;

    /* Clear the registers only if BND prefix is missing, MPX is enabled,
       and if the BNDREGs are known to be in use (non-zero) already.
       The helper itself will check BNDPRESERVE at runtime.  */
    if ((s->prefix & PREFIX_REPNZ) == 0
        && (s->flags & HF_MPX_EN_MASK) != 0
        && (s->flags & HF_MPX_IU_MASK) != 0) {
        gen_helper_bnd_jmp(tcg_ctx, tcg_ctx->cpu_env);
    }
}